

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

bool Am_Standard_Selective_New_Allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value param_3)

{
  bool bVar1;
  Am_Value local_40;
  Am_Value local_30;
  
  Am_Value::Am_Value(&local_30,new_selection);
  bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_30,true);
  Am_Value::~Am_Value(&local_30);
  if (bVar1) {
    Am_Value::Am_Value(&local_40,new_selection);
    bVar1 = Am_Check_One_Or_More_For_Inactive_Slot(&local_40,command_obj);
    Am_Value::~Am_Value(&local_40);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 Am_Standard_Selective_New_Allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value /* new_value */))
{
  if (Am_Valid_and_Visible_List_Or_Object(new_selection))
    return Am_Check_One_Or_More_For_Inactive_Slot(new_selection, command_obj);
  else
    return false;
}